

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O2

jvirt_barray_ptr *
jtransform_adjust_parameters
          (j_decompress_ptr srcinfo,j_compress_ptr dstinfo,jvirt_barray_ptr *src_coef_arrays,
          jpeg_transform_info *info)

{
  JOCTET *pJVar1;
  UINT16 *pUVar2;
  UINT16 *pUVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  JXFORM_CODE JVar7;
  int iVar8;
  JDIMENSION JVar9;
  JDIMENSION JVar10;
  jpeg_component_info *pjVar11;
  jpeg_error_mgr *pjVar12;
  j_decompress_ptr cinfo;
  jvirt_barray_ptr *ppjVar13;
  jvirt_barray_ptr pjVar14;
  JQUANT_TBL *qtblptr1;
  jpeg_saved_marker_ptr_conflict pjVar15;
  JOCTET *pJVar16;
  short sVar17;
  ulong uVar18;
  long lVar19;
  JBLOCKARRAY ppaJVar20;
  JQUANT_TBL *pJVar21;
  short sVar22;
  UINT16 UVar23;
  uint uVar24;
  long lVar25;
  JDIMENSION JVar26;
  JQUANT_TBL *pJVar27;
  jpeg_component_info *compptr;
  byte bVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  JOCTET JVar32;
  long lVar33;
  JBLOCKROW paJVar34;
  ushort uVar35;
  JOCTET JVar36;
  ulong uVar37;
  JOCTET JVar38;
  JOCTET JVar39;
  JQUANT_TBL *qtblptr;
  JOCTET JVar40;
  JDIMENSION blk_y;
  uint uVar41;
  bool bVar42;
  
  if (info->force_grayscale == 0) {
    if (info->num_components == 1) {
      pjVar11 = dstinfo->comp_info;
      pjVar11->h_samp_factor = 1;
      pjVar11->v_samp_factor = 1;
    }
  }
  else {
    if (dstinfo->jpeg_color_space == JCS_GRAYSCALE) {
      if (dstinfo->num_components == 1) goto LAB_0010fa50;
    }
    else if ((dstinfo->jpeg_color_space == JCS_YCbCr) && (dstinfo->num_components == 3)) {
LAB_0010fa50:
      if ((srcinfo->comp_info->h_samp_factor == srcinfo->max_h_samp_factor) &&
         (srcinfo->comp_info->v_samp_factor == srcinfo->max_v_samp_factor)) {
        iVar8 = dstinfo->comp_info->quant_tbl_no;
        jpeg_set_colorspace(dstinfo,JCS_GRAYSCALE);
        dstinfo->comp_info->quant_tbl_no = iVar8;
        goto LAB_0010fa99;
      }
    }
    pjVar12 = dstinfo->err;
    pjVar12->msg_code = 0x1b;
    (*pjVar12->error_exit)((j_common_ptr)dstinfo);
  }
LAB_0010fa99:
  JVar7 = info->transform;
  if (JVar7 - JXFORM_TRANSPOSE < 3) {
LAB_0010fab7:
    JVar9 = info->output_height;
    dstinfo->image_width = info->output_width;
    dstinfo->image_height = JVar9;
    uVar18 = 0;
    uVar31 = (ulong)(uint)dstinfo->num_components;
    if (dstinfo->num_components < 1) {
      uVar31 = uVar18;
    }
    for (; uVar31 * 0x60 - uVar18 != 0; uVar18 = uVar18 + 0x60) {
      uVar4 = *(undefined8 *)((long)&dstinfo->comp_info->h_samp_factor + uVar18);
      *(ulong *)((long)&dstinfo->comp_info->h_samp_factor + uVar18) =
           CONCAT44((int)uVar4,(int)((ulong)uVar4 >> 0x20));
    }
    for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
      pJVar21 = dstinfo->quant_tbl_ptrs[lVar19];
      if (pJVar21 != (JQUANT_TBL *)0x0) {
        lVar25 = 0;
        pJVar27 = pJVar21;
        for (lVar30 = 0; lVar30 != 8; lVar30 = lVar30 + 1) {
          for (lVar33 = 0; lVar25 != lVar33; lVar33 = lVar33 + 2) {
            UVar23 = *(UINT16 *)((long)pJVar21->quantval + lVar33);
            *(UINT16 *)((long)pJVar21->quantval + lVar33) = pJVar27->quantval[lVar33 * 4];
            pJVar27->quantval[lVar33 * 4] = UVar23;
          }
          pJVar27 = (JQUANT_TBL *)(pJVar27->quantval + 1);
          pJVar21 = (JQUANT_TBL *)(pJVar21->quantval + 8);
          lVar25 = lVar25 + 2;
        }
      }
    }
  }
  else if (JVar7 == JXFORM_DROP) {
    if ((info->drop_width != 0) && (info->drop_height != 0)) {
      cinfo = info->drop_ptr;
      ppjVar13 = info->drop_coef_arrays;
      iVar8 = info->trim;
      for (lVar19 = 0; (lVar19 < dstinfo->num_components && (lVar19 < cinfo->num_components));
          lVar19 = lVar19 + 1) {
        pjVar11 = cinfo->comp_info + lVar19;
        pJVar21 = srcinfo->comp_info[lVar19].quant_table;
        compptr = srcinfo->comp_info + lVar19;
        pJVar27 = cinfo->comp_info[lVar19].quant_table;
        lVar25 = 0;
        do {
          if (lVar25 == 0x40) goto LAB_0010fd48;
          pUVar3 = pJVar21->quantval + lVar25;
          pUVar2 = pJVar27->quantval + lVar25;
          lVar25 = lVar25 + 1;
        } while (*pUVar3 == *pUVar2);
        if (iVar8 == 0) {
          qtblptr1 = dstinfo->quant_tbl_ptrs[compptr->quant_tbl_no];
          for (lVar25 = 0; lVar25 != 0x40; lVar25 = lVar25 + 1) {
            uVar41 = (uint)pJVar27->quantval[lVar25];
            uVar29 = (uint)pJVar21->quantval[lVar25];
            if (pJVar21->quantval[lVar25] != pJVar27->quantval[lVar25]) {
              do {
                uVar24 = uVar41;
                UVar23 = (UINT16)uVar24;
                uVar41 = (int)(short)uVar29 % (int)(short)UVar23;
                uVar29 = uVar24;
              } while (uVar41 != 0);
              qtblptr1->quantval[lVar25] = UVar23;
            }
          }
          dequant_comp(srcinfo,compptr,src_coef_arrays[lVar19],qtblptr1);
          dequant_comp(cinfo,pjVar11,ppjVar13[lVar19],qtblptr1);
        }
        else {
          pjVar14 = ppjVar13[lVar19];
          for (uVar41 = 0; uVar41 < pjVar11->height_in_blocks; uVar41 = uVar41 + uVar29) {
            ppaJVar20 = (*cinfo->mem->access_virt_barray)
                                  ((j_common_ptr)cinfo,pjVar14,uVar41,pjVar11->v_samp_factor,1);
            uVar29 = pjVar11->v_samp_factor;
            uVar31 = 0;
            if (0 < (int)uVar29) {
              uVar31 = (ulong)uVar29;
            }
            for (uVar18 = 0; uVar18 != uVar31; uVar18 = uVar18 + 1) {
              paJVar34 = ppaJVar20[uVar18];
              uVar24 = pjVar11->width_in_blocks;
              for (uVar37 = 0; uVar37 != uVar24; uVar37 = uVar37 + 1) {
                for (lVar25 = 0; lVar25 != 0x40; lVar25 = lVar25 + 1) {
                  UVar23 = pJVar21->quantval[lVar25];
                  if (pJVar27->quantval[lVar25] != UVar23) {
                    sVar17 = pJVar27->quantval[lVar25] * (*paJVar34)[lVar25];
                    sVar22 = (short)((uint)(int)(short)UVar23 >> 1);
                    if (sVar17 < 0) {
                      sVar22 = sVar22 - sVar17;
                      if (sVar22 < (short)UVar23) {
                        sVar17 = 0;
                      }
                      else {
                        sVar17 = sVar22 / (short)UVar23;
                      }
                      sVar17 = -sVar17;
                    }
                    else {
                      sVar17 = sVar17 + sVar22;
                      if (sVar17 < (short)UVar23) {
                        sVar17 = 0;
                      }
                      else {
                        sVar17 = sVar17 / (short)UVar23;
                      }
                    }
                    (*paJVar34)[lVar25] = sVar17;
                  }
                }
                paJVar34 = paJVar34 + 1;
              }
            }
          }
        }
LAB_0010fd48:
      }
    }
  }
  else {
    if (JVar7 == JXFORM_ROT_270) goto LAB_0010fab7;
    JVar9 = info->output_height;
    dstinfo->image_width = info->output_width;
    dstinfo->image_height = JVar9;
  }
  pjVar15 = srcinfo->marker_list;
  if ((((((pjVar15 != (jpeg_saved_marker_ptr_conflict)0x0) && (pjVar15->marker == 0xe1)) &&
        (uVar41 = pjVar15->data_length, 5 < uVar41)) &&
       ((pJVar16 = pjVar15->data, *pJVar16 == 'E' && (pJVar16[1] == 'x')))) && (pJVar16[2] == 'i'))
     && (((pJVar16[3] == 'f' && (pJVar16[4] == '\0')) && (pJVar16[5] == '\0')))) {
    dstinfo->write_JFIF_header = 0;
    JVar9 = dstinfo->image_width;
    JVar10 = dstinfo->image_height;
    if (((JVar9 != srcinfo->image_width) || (JVar10 != srcinfo->image_height)) && (0xb < uVar41 - 6)
       ) {
      pJVar1 = pJVar16 + 6;
      if (*pJVar1 == 'M') {
        if (((pJVar16[7] != 'M') || (pJVar16[8] != '\0')) ||
           ((pJVar16[9] != '*' || ((pJVar16[10] != '\0' || (pJVar16[0xb] != '\0'))))))
        goto LAB_0010fdad;
        uVar35 = *(ushort *)(pJVar16 + 0xc) << 8 | *(ushort *)(pJVar16 + 0xc) >> 8;
        if (uVar41 - 8 < (uint)uVar35) goto LAB_0010fdad;
        uVar31 = (ulong)(uint)uVar35;
        uVar18 = uVar31 + 1;
        bVar28 = 0;
      }
      else {
        if (((((*pJVar1 != 'I') || (pJVar16[7] != 'I')) || (pJVar16[9] != '\0')) ||
            ((pJVar16[8] != '*' || (pJVar16[0xd] != '\0')))) || (pJVar16[0xc] != '\0'))
        goto LAB_0010fdad;
        uVar35 = *(ushort *)(pJVar16 + 10);
        if (uVar41 - 8 < (uint)uVar35) goto LAB_0010fdad;
        uVar18 = (ulong)(uint)uVar35;
        uVar31 = uVar18 + 1;
        bVar28 = 1;
      }
      if (CONCAT11(pJVar1[uVar31],pJVar1[uVar18]) != 0) {
        uVar37 = (ulong)uVar35;
        for (lVar19 = 0; uVar37 + 2 + lVar19 <= (ulong)(uVar41 - 0x12); lVar19 = lVar19 + 0xc) {
          if (bVar28 == 0) {
            if ((ushort)(*(ushort *)(pJVar16 + lVar19 + uVar37 + 8) << 8 |
                        *(ushort *)(pJVar16 + lVar19 + uVar37 + 8) >> 8) == 0x8769) {
              if ((pJVar16[lVar19 + 0x10 + uVar37] == '\0') &&
                 (pJVar16[lVar19 + 0x11 + uVar37] == '\0')) {
                uVar35 = *(ushort *)(pJVar16 + lVar19 + 0x12 + uVar37) << 8 |
                         *(ushort *)(pJVar16 + lVar19 + 0x12 + uVar37) >> 8;
                if ((uint)uVar35 <= uVar41 - 8) {
                  uVar31 = (ulong)(uint)uVar35;
                  uVar18 = uVar31 + 1;
                  goto LAB_0010ffa5;
                }
              }
              break;
            }
          }
          else if (*(short *)(pJVar16 + lVar19 + uVar37 + 8) == -0x7897) {
            if ((pJVar16[lVar19 + 0x13 + uVar37] == '\0') &&
               (pJVar16[lVar19 + 0x12 + uVar37] == '\0')) {
              uVar35 = *(ushort *)(pJVar16 + lVar19 + 0x10 + uVar37);
              if ((uint)uVar35 <= uVar41 - 8) {
                uVar18 = (ulong)(uint)uVar35;
                uVar31 = uVar18 + 1;
LAB_0010ffa5:
                bVar5 = pJVar1[uVar31];
                bVar6 = pJVar1[uVar18];
                if (1 < CONCAT11(bVar5,bVar6)) {
                  uVar31 = (ulong)uVar35;
                  lVar19 = 0;
                  goto LAB_00110011;
                }
              }
            }
            break;
          }
          if ((uint)pJVar1[uVar31] * 0xc00 + (uint)pJVar1[uVar18] * 0xc + -0xc == (int)lVar19)
          break;
        }
      }
    }
  }
LAB_0010fdad:
  if (info->workspace_coef_arrays != (jvirt_barray_ptr *)0x0) {
    src_coef_arrays = info->workspace_coef_arrays;
  }
  return src_coef_arrays;
  while( true ) {
    if ((CONCAT11(pJVar16[lVar19 + bVar28 + uVar31 + 8],pJVar16[lVar19 + (bVar28 ^ 1) + uVar31 + 8])
        & 0xfffe) == 0xa002) {
      JVar26 = JVar10;
      if (CONCAT11(pJVar16[lVar19 + bVar28 + uVar31 + 8],pJVar16[lVar19 + (bVar28 ^ 1) + uVar31 + 8]
                  ) == 0xa002) {
        JVar26 = JVar9;
      }
      bVar42 = bVar28 == 0;
      JVar39 = (JOCTET)(JVar26 >> 8);
      if (bVar42) {
        JVar38 = '\x04';
        JVar36 = '\0';
        JVar32 = '\0';
        JVar40 = '\0';
      }
      else {
        JVar36 = '\x04';
        JVar38 = '\0';
        JVar32 = (JOCTET)JVar26;
        JVar26 = 0;
        JVar40 = JVar39;
        JVar39 = '\0';
      }
      pJVar16[lVar19 + uVar31 + 10] = JVar36;
      pJVar16[lVar19 + uVar31 + 0xb] = JVar38;
      pJVar16[lVar19 + uVar31 + 0xc] = !bVar42;
      (pJVar16 + lVar19 + uVar31 + 0xd)[0] = '\0';
      (pJVar16 + lVar19 + uVar31 + 0xd)[1] = '\0';
      pJVar16[lVar19 + uVar31 + 0xf] = bVar42;
      pJVar16[lVar19 + uVar31 + 0x10] = JVar32;
      pJVar16[lVar19 + uVar31 + 0x11] = JVar40;
      pJVar16[lVar19 + uVar31 + 0x12] = JVar39;
      pJVar16[lVar19 + uVar31 + 0x13] = (JOCTET)JVar26;
    }
    lVar19 = lVar19 + 0xc;
    if ((uint)bVar6 * 0xc + (uint)bVar5 * 0xc00 == (int)lVar19) break;
LAB_00110011:
    if ((ulong)(uVar41 - 0x12) < uVar31 + lVar19 + 2) break;
  }
  goto LAB_0010fdad;
}

Assistant:

GLOBAL(jvirt_barray_ptr *)
jtransform_adjust_parameters(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                             jvirt_barray_ptr *src_coef_arrays,
                             jpeg_transform_info *info)
{
  /* If force-to-grayscale is requested, adjust destination parameters */
  if (info->force_grayscale) {
    /* First, ensure we have YCbCr or grayscale data, and that the source's
     * Y channel is full resolution.  (No reasonable person would make Y
     * be less than full resolution, so actually coping with that case
     * isn't worth extra code space.  But we check it to avoid crashing.)
     */
    if (((dstinfo->jpeg_color_space == JCS_YCbCr &&
          dstinfo->num_components == 3) ||
         (dstinfo->jpeg_color_space == JCS_GRAYSCALE &&
          dstinfo->num_components == 1)) &&
        srcinfo->comp_info[0].h_samp_factor == srcinfo->max_h_samp_factor &&
        srcinfo->comp_info[0].v_samp_factor == srcinfo->max_v_samp_factor) {
      /* We use jpeg_set_colorspace to make sure subsidiary settings get fixed
       * properly.  Among other things, it sets the target h_samp_factor &
       * v_samp_factor to 1, which typically won't match the source.
       * We have to preserve the source's quantization table number, however.
       */
      int sv_quant_tbl_no = dstinfo->comp_info[0].quant_tbl_no;
      jpeg_set_colorspace(dstinfo, JCS_GRAYSCALE);
      dstinfo->comp_info[0].quant_tbl_no = sv_quant_tbl_no;
    } else {
      /* Sorry, can't do it */
      ERREXIT(dstinfo, JERR_CONVERSION_NOTIMPL);
    }
  } else if (info->num_components == 1) {
    /* For a single-component source, we force the destination sampling factors
     * to 1x1, with or without force_grayscale.  This is useful because some
     * decoders choke on grayscale images with other sampling factors.
     */
    dstinfo->comp_info[0].h_samp_factor = 1;
    dstinfo->comp_info[0].v_samp_factor = 1;
  }

  /* Correct the destination's image dimensions as necessary
   * for rotate/flip, resize, and crop operations.
   */
#if JPEG_LIB_VERSION >= 80
  dstinfo->jpeg_width = info->output_width;
  dstinfo->jpeg_height = info->output_height;
#endif

  /* Transpose destination image parameters, adjust quantization */
  switch (info->transform) {
  case JXFORM_TRANSPOSE:
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_90:
  case JXFORM_ROT_270:
#if JPEG_LIB_VERSION < 80
    dstinfo->image_width = info->output_height;
    dstinfo->image_height = info->output_width;
#endif
    transpose_critical_parameters(dstinfo);
    break;
  case JXFORM_DROP:
    if (info->drop_width != 0 && info->drop_height != 0)
      adjust_quant(srcinfo, src_coef_arrays,
                   info->drop_ptr, info->drop_coef_arrays,
                   info->trim, dstinfo);
    break;
  default:
#if JPEG_LIB_VERSION < 80
    dstinfo->image_width = info->output_width;
    dstinfo->image_height = info->output_height;
#endif
    break;
  }

  /* Adjust Exif properties */
  if (srcinfo->marker_list != NULL &&
      srcinfo->marker_list->marker == JPEG_APP0 + 1 &&
      srcinfo->marker_list->data_length >= 6 &&
      srcinfo->marker_list->data[0] == 0x45 &&
      srcinfo->marker_list->data[1] == 0x78 &&
      srcinfo->marker_list->data[2] == 0x69 &&
      srcinfo->marker_list->data[3] == 0x66 &&
      srcinfo->marker_list->data[4] == 0 &&
      srcinfo->marker_list->data[5] == 0) {
    /* Suppress output of JFIF marker */
    dstinfo->write_JFIF_header = FALSE;
    /* Adjust Exif image parameters */
#if JPEG_LIB_VERSION >= 80
    if (dstinfo->jpeg_width != srcinfo->image_width ||
        dstinfo->jpeg_height != srcinfo->image_height)
      /* Align data segment to start of TIFF structure for parsing */
      adjust_exif_parameters(srcinfo->marker_list->data + 6,
                             srcinfo->marker_list->data_length - 6,
                             dstinfo->jpeg_width, dstinfo->jpeg_height);
#else
    if (dstinfo->image_width != srcinfo->image_width ||
        dstinfo->image_height != srcinfo->image_height)
      /* Align data segment to start of TIFF structure for parsing */
      adjust_exif_parameters(srcinfo->marker_list->data + 6,
                             srcinfo->marker_list->data_length - 6,
                             dstinfo->image_width, dstinfo->image_height);
#endif
  }

  /* Return the appropriate output data set */
  if (info->workspace_coef_arrays != NULL)
    return info->workspace_coef_arrays;
  return src_coef_arrays;
}